

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_detections.c
# Opt level: O3

char * kws_detections_hyp_str(kws_detections_t *detections,int frame,int delay)

{
  undefined8 *puVar1;
  size_t sVar2;
  char *pcVar3;
  gnode_s *pgVar4;
  glist_t pgVar5;
  char *pcVar6;
  char *__dest;
  
  pgVar5 = detections->detect_list;
  pcVar3 = (char *)0x0;
  if (pgVar5 != (glist_t)0x0) {
    do {
      if (*(int *)((long)(pgVar5->data).ptr + 0xc) < frame - delay) {
        sVar2 = strlen(*(pgVar5->data).ptr);
        pcVar3 = (char *)(ulong)((int)pcVar3 + (int)sVar2 + 1);
      }
      pgVar5 = pgVar5->next;
    } while (pgVar5 != (gnode_s *)0x0);
    if ((int)pcVar3 == 0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = (char *)__ckd_calloc__((long)(int)pcVar3,1,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/kws_detections.c"
                                      ,0x67);
      pgVar4 = glist_reverse(detections->detect_list);
      detections->detect_list = pgVar4;
      __dest = pcVar3;
      if (pgVar4 != (glist_t)0x0) {
        do {
          puVar1 = (undefined8 *)(pgVar4->data).ptr;
          if (*(int *)((long)puVar1 + 0xc) < frame - delay) {
            pcVar6 = (char *)*puVar1;
            sVar2 = strlen(pcVar6);
            memcpy(__dest,pcVar6,sVar2);
            sVar2 = strlen((char *)*puVar1);
            pcVar6 = __dest + sVar2;
            __dest = pcVar6 + 1;
            *pcVar6 = ' ';
          }
          pgVar4 = pgVar4->next;
        } while (pgVar4 != (gnode_s *)0x0);
        if (pcVar3 < __dest) {
          __dest[-1] = '\0';
        }
      }
      pgVar5 = glist_reverse(detections->detect_list);
      detections->detect_list = pgVar5;
    }
  }
  return pcVar3;
}

Assistant:

char *
kws_detections_hyp_str(kws_detections_t *detections, int frame, int delay)
{
    gnode_t *gn;
    char *c;
    int len;
    char *hyp_str;

    len = 0;
    for (gn = detections->detect_list; gn; gn = gnode_next(gn)) {
	kws_detection_t *det = (kws_detection_t *)gnode_ptr(gn);
	if (det->ef < frame - delay) {
	    len += strlen(det->keyphrase) + 1;
	}
    }

    if (len == 0) {
        return NULL;
    }

    hyp_str = (char *)ckd_calloc(len, sizeof(char));
    c = hyp_str;
    detections->detect_list = glist_reverse(detections->detect_list);
    for (gn = detections->detect_list; gn; gn = gnode_next(gn)) {
	kws_detection_t *det = (kws_detection_t *)gnode_ptr(gn);
	if (det->ef < frame - delay) {
            memcpy(c, det->keyphrase, strlen(det->keyphrase));
    	    c += strlen(det->keyphrase);
    	    *c = ' ';
    	    c++;
    	}
    }
    if (c > hyp_str) {
        c--;
	*c = '\0';
    }
    detections->detect_list = glist_reverse(detections->detect_list);
    return hyp_str;
}